

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

ssize_t __thiscall
LinkedReadsDatastore::read(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  string sStack_38;
  
  sdglib::read_string((ifstream *)CONCAT44(in_register_00000034,__fd),&this->filename);
  sdglib::read_string((ifstream *)CONCAT44(in_register_00000034,__fd),&this->name);
  std::__cxx11::string::string((string *)&sStack_38,(string *)this);
  load_index(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  sVar1 = LinkedReadsMapper::read(&this->mapper,__fd,__buf_00,__nbytes);
  return sVar1;
}

Assistant:

void LinkedReadsDatastore::read(std::ifstream &input_file) {
    //read filename
    sdglib::read_string(input_file, filename);
    sdglib::read_string(input_file, name);

    load_index(filename);
    mapper.read(input_file);
}